

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
* __thiscall
testing::internal::
MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
::operator=(MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
            *this,MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
                  *other)

{
  bool bVar1;
  MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
  *other_local;
  MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
  *this_local;
  
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    bVar1 = IsShared(this);
    if (bVar1) {
      SharedPayloadBase::Ref((this->buffer_).shared);
    }
  }
  return this;
}

Assistant:

MatcherBase& operator=(const MatcherBase& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    if (IsShared()) buffer_.shared->Ref();
    return *this;
  }